

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

void SSL_set_shutdown(SSL *ssl,int mode)

{
  uint uVar1;
  
  uVar1 = SSL_get_shutdown(ssl);
  if ((uVar1 & ~mode) == 0) {
    if (((mode & 2U) != 0) && (*(int *)(ssl->handshake_func + 0xac) == 0)) {
      *(undefined4 *)(ssl->handshake_func + 0xac) = 1;
    }
    if (((mode & 1U) != 0) && (*(int *)(ssl->handshake_func + 0xb0) == 0)) {
      *(undefined4 *)(ssl->handshake_func + 0xb0) = 1;
    }
    return;
  }
  __assert_fail("(SSL_get_shutdown(ssl) & mode) == SSL_get_shutdown(ssl)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                ,0x98d,"void SSL_set_shutdown(SSL *, int)");
}

Assistant:

void SSL_set_shutdown(SSL *ssl, int mode) {
  // It is an error to clear any bits that have already been set. (We can't try
  // to get a second close_notify or send two.)
  assert((SSL_get_shutdown(ssl) & mode) == SSL_get_shutdown(ssl));

  if (mode & SSL_RECEIVED_SHUTDOWN &&
      ssl->s3->read_shutdown == ssl_shutdown_none) {
    ssl->s3->read_shutdown = ssl_shutdown_close_notify;
  }

  if (mode & SSL_SENT_SHUTDOWN &&
      ssl->s3->write_shutdown == ssl_shutdown_none) {
    ssl->s3->write_shutdown = ssl_shutdown_close_notify;
  }
}